

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromFormat(ArrowType *this,string *format)

{
  char *pcVar1;
  bool bVar2;
  uchar width;
  uchar scale;
  int val;
  reference pvVar3;
  unsigned_long_long val_00;
  unsigned_long_long val_01;
  unsigned_long_long uVar4;
  InvalidInputException *pIVar5;
  NotImplementedException *pNVar6;
  LogicalTypeId *args;
  pointer pbVar7;
  allocator local_d9;
  string parameters_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  extra_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = ::std::operator==(format,"n");
  if (bVar2) {
    args = &LogicalType::SQLNULL;
LAB_00a77aaa:
    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&>((duckdb *)this,args);
    return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
           (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
  }
  bVar2 = ::std::operator==(format,"b");
  if (bVar2) {
    args = &LogicalType::BOOLEAN;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"c");
  if (bVar2) {
    args = &LogicalType::TINYINT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"s");
  if (bVar2) {
    args = &LogicalType::SMALLINT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"i");
  if (bVar2) {
    args = &LogicalType::INTEGER;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"l");
  if (bVar2) {
    args = &LogicalType::BIGINT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"C");
  if (bVar2) {
    args = &LogicalType::UTINYINT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"S");
  if (bVar2) {
    args = &LogicalType::USMALLINT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"I");
  if (bVar2) {
    args = &LogicalType::UINTEGER;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"L");
  if (bVar2) {
    args = &LogicalType::UBIGINT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"f");
  if (bVar2) {
    args = &LogicalType::FLOAT;
    goto LAB_00a77aaa;
  }
  bVar2 = ::std::operator==(format,"g");
  if (bVar2) {
    args = &LogicalType::DOUBLE;
    goto LAB_00a77aaa;
  }
  if (*(format->_M_dataplus)._M_p == 'd') {
    StringUtil::Split(&extra_info,format,':');
    if ((long)extra_info.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)extra_info.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&parameters_1,
                 "Decimal format of Arrow object is incomplete, it is missing the scale and width. Current format: %s"
                 ,(allocator *)&parameters);
      ::std::__cxx11::string::string((string *)&local_48,(string *)format);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar5,&parameters_1,&local_48);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&extra_info,1);
    ::std::__cxx11::string::string((string *)&parameters_1,",",&local_d9);
    StringUtil::Split(&parameters,pvVar3,&parameters_1);
    ::std::__cxx11::string::~string((string *)&parameters_1);
    if (((long)parameters.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         CONCAT71(parameters.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                  parameters.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_1_) & 0xffffffffffffffc0U) == 0x40) {
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&parameters,0);
      val_00 = ::std::__cxx11::stoull(pvVar3,(size_t *)0x0,10);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&parameters,1);
      val_01 = ::std::__cxx11::stoull(pvVar3,(size_t *)0x0,10);
      if ((long)parameters.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          CONCAT71(parameters.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                   parameters.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_1_) == 0x60) {
        pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&parameters,2);
        uVar4 = ::std::__cxx11::stoull(pvVar3,(size_t *)0x0,10);
        bVar2 = 0x80 < uVar4;
      }
      else {
        bVar2 = false;
      }
      if ((val_00 < 0x27) && (!bVar2)) {
        width = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val_00);
        scale = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val_01);
        LogicalType::DECIMAL((LogicalType *)&parameters_1,width,scale);
        make_uniq<duckdb::ArrowType,duckdb::LogicalType>
                  ((duckdb *)this,(LogicalType *)&parameters_1);
        LogicalType::~LogicalType((LogicalType *)&parameters_1);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parameters);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&extra_info);
        return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
               (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
      }
      pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&parameters_1,"Unsupported Internal Arrow Type for Decimal %s",&local_d9)
      ;
      ::std::__cxx11::string::string((string *)&local_88,(string *)format);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (pNVar6,&parameters_1,&local_88);
      __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&parameters_1,
               "Decimal format of Arrow object is incomplete, it is missing the scale or width. Current format: %s"
               ,&local_d9);
    ::std::__cxx11::string::string((string *)&local_68,(string *)format);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar5,&parameters_1,&local_68);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar2 = ::std::operator==(format,"u");
  if (bVar2) {
    extra_info.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)extra_info.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
              ((duckdb *)&parameters_1,(ArrowVariableSizeType *)&extra_info);
    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
              ((duckdb *)this,&LogicalType::VARCHAR,
               (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                *)&parameters_1);
  }
  else {
    bVar2 = ::std::operator==(format,"U");
    if (bVar2) {
      extra_info.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(extra_info.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,2);
      make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                ((duckdb *)&parameters_1,(ArrowVariableSizeType *)&extra_info);
      make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                ((duckdb *)this,&LogicalType::VARCHAR,
                 (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                  *)&parameters_1);
    }
    else {
      bVar2 = ::std::operator==(format,"vu");
      if (bVar2) {
        extra_info.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(extra_info.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,3);
        make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                  ((duckdb *)&parameters_1,(ArrowVariableSizeType *)&extra_info);
        make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                  ((duckdb *)this,&LogicalType::VARCHAR,
                   (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                    *)&parameters_1);
      }
      else {
        bVar2 = ::std::operator==(format,"tsn:");
        if (bVar2) {
          parameters_1._M_dataplus._M_p._0_1_ = 0x14;
LAB_00a77d72:
          make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId>
                    ((duckdb *)this,(LogicalTypeId *)&parameters_1);
          return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
                 (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
        }
        bVar2 = ::std::operator==(format,"tsu:");
        if (bVar2) {
          parameters_1._M_dataplus._M_p._0_1_ = 0x13;
          goto LAB_00a77d72;
        }
        bVar2 = ::std::operator==(format,"tsm:");
        if (bVar2) {
          parameters_1._M_dataplus._M_p._0_1_ = 0x12;
          goto LAB_00a77d72;
        }
        bVar2 = ::std::operator==(format,"tss:");
        if (bVar2) {
          parameters_1._M_dataplus._M_p._0_1_ = 0x11;
          goto LAB_00a77d72;
        }
        bVar2 = ::std::operator==(format,"tdD");
        if (bVar2) {
          extra_info.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(extra_info.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,4);
          make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                    ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
          make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                    ((duckdb *)this,&LogicalType::DATE,
                     (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                      *)&parameters_1);
        }
        else {
          bVar2 = ::std::operator==(format,"tdm");
          if (bVar2) {
            extra_info.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)extra_info.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
            make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                      ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                      ((duckdb *)this,&LogicalType::DATE,
                       (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                        *)&parameters_1);
          }
          else {
            bVar2 = ::std::operator==(format,"tts");
            if (bVar2) {
              extra_info.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(extra_info.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,3);
              make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                        ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                        ((duckdb *)this,&LogicalType::TIME,
                         (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                          *)&parameters_1);
            }
            else {
              bVar2 = ::std::operator==(format,"ttm");
              if (bVar2) {
                extra_info.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((ulong)extra_info.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00
                              );
                make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                          ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                          ((duckdb *)this,&LogicalType::TIME,
                           (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                            *)&parameters_1);
              }
              else {
                bVar2 = ::std::operator==(format,"ttu");
                if (bVar2) {
                  extra_info.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT71(extra_info.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                            ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                            ((duckdb *)this,&LogicalType::TIME,
                             (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                              *)&parameters_1);
                }
                else {
                  bVar2 = ::std::operator==(format,"ttn");
                  if (bVar2) {
                    extra_info.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT71(extra_info.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,2);
                    make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                              ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                              ((duckdb *)this,&LogicalType::TIME,
                               (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                *)&parameters_1);
                  }
                  else {
                    bVar2 = ::std::operator==(format,"tDs");
                    if (bVar2) {
                      extra_info.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT71(extra_info.
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,3);
                      make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                      make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                ((duckdb *)this,&LogicalType::INTERVAL,
                                 (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                  *)&parameters_1);
                    }
                    else {
                      bVar2 = ::std::operator==(format,"tDm");
                      if (bVar2) {
                        extra_info.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)((ulong)extra_info.
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start &
                                      0xffffffffffffff00);
                        make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                  ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                        make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                  ((duckdb *)this,&LogicalType::INTERVAL,
                                   (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                    *)&parameters_1);
                      }
                      else {
                        bVar2 = ::std::operator==(format,"tDu");
                        if (bVar2) {
                          extra_info.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)CONCAT71(extra_info.
                                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
                          make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                    ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                          make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                    ((duckdb *)this,&LogicalType::INTERVAL,
                                     (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                      *)&parameters_1);
                        }
                        else {
                          bVar2 = ::std::operator==(format,"tDn");
                          if (bVar2) {
                            extra_info.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(extra_info.
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,2)
                            ;
                            make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                      ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                      ((duckdb *)this,&LogicalType::INTERVAL,
                                       (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                        *)&parameters_1);
                          }
                          else {
                            bVar2 = ::std::operator==(format,"tiD");
                            if (bVar2) {
                              extra_info.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)CONCAT71(extra_info.
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,4)
                              ;
                              make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                        ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info);
                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                        ((duckdb *)this,&LogicalType::INTERVAL,
                                         (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                          *)&parameters_1);
                            }
                            else {
                              bVar2 = ::std::operator==(format,"tiM");
                              if (bVar2) {
                                extra_info.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)CONCAT71(extra_info.
                                                                                                              
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,5)
                                ;
                                make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                          ((duckdb *)&parameters_1,(ArrowDateTimeType *)&extra_info)
                                ;
                                make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                          ((duckdb *)this,&LogicalType::INTERVAL,
                                           (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                            *)&parameters_1);
                              }
                              else {
                                bVar2 = ::std::operator==(format,"tin");
                                if (bVar2) {
                                  extra_info.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start =
                                       (pointer)CONCAT71(extra_info.
                                                                                                                  
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,6)
                                  ;
                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                            ((duckdb *)&parameters_1,
                                             (ArrowDateTimeType *)&extra_info);
                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                             (unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                              *)&parameters_1);
                                }
                                else {
                                  bVar2 = ::std::operator==(format,"z");
                                  if (bVar2) {
                                    extra_info.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start =
                                         (pointer)((ulong)extra_info.
                                                                                                                    
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                    make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                              ((duckdb *)&parameters_1,
                                               (ArrowVariableSizeType *)&extra_info);
                                    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                              ((duckdb *)this,&LogicalType::BLOB,
                                               (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                *)&parameters_1);
                                  }
                                  else {
                                    bVar2 = ::std::operator==(format,"Z");
                                    if (!bVar2) {
                                      pcVar1 = (format->_M_dataplus)._M_p;
                                      if (*pcVar1 != 't') {
                                        if (*pcVar1 == 'w') {
                                          ::std::__cxx11::string::find((char)format,0x3a);
                                          ::std::__cxx11::string::substr
                                                    ((ulong)&parameters_1,(ulong)format);
                                          val = std::__cxx11::stoi(&parameters_1,(size_t *)0x0,10);
                                          extra_info.
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start =
                                               (pointer)NumericCastImpl<unsigned_long,_int,_false>::
                                                        Convert(val);
                                          make_uniq<duckdb::ArrowStringInfo,unsigned_long&>
                                                    ((duckdb *)&parameters,
                                                     (unsigned_long *)&extra_info);
                                          make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                    ((duckdb *)this,&LogicalType::BLOB,
                                                     (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)&parameters);
                                          if ((long *)CONCAT71(parameters.
                                                                                                                              
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  parameters.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)
                                              != (long *)0x0) {
                                            (**(code **)(*(long *)CONCAT71(parameters.
                                                                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  parameters.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  8))();
                                          }
                                          ::std::__cxx11::string::~string((string *)&parameters_1);
                                          return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                                                  )(
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                                                  )this;
                                        }
LAB_00a78333:
                                        (this->extension_data).internal.
                                        super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr = (element_type *)0x0;
                                        return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                                                )(unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                                                  )this;
                                      }
                                      if (pcVar1[1] != 's') goto LAB_00a78333;
                                      switch(pcVar1[2]) {
                                      case 'm':
                                        parameters.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                                        make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                  ((duckdb *)&parameters_1,
                                                   (ArrowDateTimeType *)&parameters);
                                        break;
                                      case 'n':
                                        parameters.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 2;
                                        make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                  ((duckdb *)&parameters_1,
                                                   (ArrowDateTimeType *)&parameters);
                                        break;
                                      default:
                                        pNVar6 = (NotImplementedException *)
                                                 __cxa_allocate_exception(0x10);
                                        ::std::__cxx11::string::string
                                                  ((string *)&parameters_1,
                                                   " Timestamptz precision of not accepted",
                                                   (allocator *)&parameters);
                                        NotImplementedException::NotImplementedException
                                                  (pNVar6,&parameters_1);
                                        __cxa_throw(pNVar6,&NotImplementedException::typeinfo,
                                                    ::std::runtime_error::~runtime_error);
                                      case 's':
                                        parameters.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 3;
                                        make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                  ((duckdb *)&parameters_1,
                                                   (ArrowDateTimeType *)&parameters);
                                        break;
                                      case 'u':
                                        parameters.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
                                        make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                  ((duckdb *)&parameters_1,
                                                   (ArrowDateTimeType *)&parameters);
                                      }
                                      extra_info.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)CONCAT71(parameters_1._M_dataplus._M_p._1_7_,
                                                             parameters_1._M_dataplus._M_p._0_1_);
                                      make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>>
                                                ((duckdb *)this,&LogicalType::TIMESTAMP_TZ,
                                                 (unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                                                  *)&extra_info);
                                      pbVar7 = extra_info.
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                      goto LAB_00a77cec;
                                    }
                                    extra_info.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start =
                                         (pointer)CONCAT71(extra_info.
                                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,2)
                                    ;
                                    make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                              ((duckdb *)&parameters_1,
                                               (ArrowVariableSizeType *)&extra_info);
                                    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                              ((duckdb *)this,&LogicalType::BLOB,
                                               (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                *)&parameters_1);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pbVar7 = (pointer)CONCAT71(parameters_1._M_dataplus._M_p._1_7_,parameters_1._M_dataplus._M_p._0_1_
                            );
LAB_00a77cec:
  if (pbVar7 == (pointer)0x0) {
    return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
           (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
  }
  (**(code **)((pbVar7->_M_dataplus)._M_p + 8))();
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromFormat(string &format) {
	if (format == "n") {
		return make_uniq<ArrowType>(LogicalType::SQLNULL);
	} else if (format == "b") {
		return make_uniq<ArrowType>(LogicalType::BOOLEAN);
	} else if (format == "c") {
		return make_uniq<ArrowType>(LogicalType::TINYINT);
	} else if (format == "s") {
		return make_uniq<ArrowType>(LogicalType::SMALLINT);
	} else if (format == "i") {
		return make_uniq<ArrowType>(LogicalType::INTEGER);
	} else if (format == "l") {
		return make_uniq<ArrowType>(LogicalType::BIGINT);
	} else if (format == "C") {
		return make_uniq<ArrowType>(LogicalType::UTINYINT);
	} else if (format == "S") {
		return make_uniq<ArrowType>(LogicalType::USMALLINT);
	} else if (format == "I") {
		return make_uniq<ArrowType>(LogicalType::UINTEGER);
	} else if (format == "L") {
		return make_uniq<ArrowType>(LogicalType::UBIGINT);
	} else if (format == "f") {
		return make_uniq<ArrowType>(LogicalType::FLOAT);
	} else if (format == "g") {
		return make_uniq<ArrowType>(LogicalType::DOUBLE);
	} else if (format[0] == 'd') { //! this can be either decimal128 or decimal 256 (e.g., d:38,0)
		auto extra_info = StringUtil::Split(format, ':');
		if (extra_info.size() != 2) {
			throw InvalidInputException(
			    "Decimal format of Arrow object is incomplete, it is missing the scale and width. Current format: %s",
			    format);
		}
		auto parameters = StringUtil::Split(extra_info[1], ",");
		// Parameters must always be 2 or 3 values (i.e., width, scale and an optional bit-width)
		if (parameters.size() != 2 && parameters.size() != 3) {
			throw InvalidInputException(
			    "Decimal format of Arrow object is incomplete, it is missing the scale or width. Current format: %s",
			    format);
		}
		uint64_t width = std::stoull(parameters[0]);
		uint64_t scale = std::stoull(parameters[1]);
		uint64_t bitwidth = 128;
		if (parameters.size() == 3) {
			// We have a bit-width defined
			bitwidth = std::stoull(parameters[2]);
		}
		if (width > 38 || bitwidth > 128) {
			throw NotImplementedException("Unsupported Internal Arrow Type for Decimal %s", format);
		}
		return make_uniq<ArrowType>(LogicalType::DECIMAL(NumericCast<uint8_t>(width), NumericCast<uint8_t>(scale)));
	} else if (format == "u") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL));
	} else if (format == "U") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR,
		                            make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE));
	} else if (format == "vu") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::VIEW));
	} else if (format == "tsn:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_NS);
	} else if (format == "tsu:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP);
	} else if (format == "tsm:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_MS);
	} else if (format == "tss:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_SEC);
	} else if (format == "tdD") {
		return make_uniq<ArrowType>(LogicalType::DATE, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::DAYS));
	} else if (format == "tdm") {
		return make_uniq<ArrowType>(LogicalType::DATE, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "tts") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS));
	} else if (format == "ttm") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "ttu") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS));
	} else if (format == "ttn") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS));
	} else if (format == "tDs") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS));
	} else if (format == "tDm") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "tDu") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS));
	} else if (format == "tDn") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS));
	} else if (format == "tiD") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::DAYS));
	} else if (format == "tiM") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MONTHS));
	} else if (format == "tin") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MONTH_DAY_NANO));
	} else if (format == "z") {
		auto type_info = make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format == "Z") {
		auto type_info = make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format[0] == 'w') {
		string parameters = format.substr(format.find(':') + 1);
		auto fixed_size = NumericCast<idx_t>(std::stoi(parameters));
		auto type_info = make_uniq<ArrowStringInfo>(fixed_size);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format[0] == 't' && format[1] == 's') {
		// Timestamp with Timezone
		// TODO right now we just get the UTC value. We probably want to support this properly in the future
		unique_ptr<ArrowTypeInfo> type_info;
		if (format[2] == 'n') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS);
		} else if (format[2] == 'u') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS);
		} else if (format[2] == 'm') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS);
		} else if (format[2] == 's') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS);
		} else {
			throw NotImplementedException(" Timestamptz precision of not accepted");
		}
		return make_uniq<ArrowType>(LogicalType::TIMESTAMP_TZ, std::move(type_info));
	}
	return nullptr;
}